

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O3

void __thiscall
TPZGenPartialGrid::ElementConnectivity
          (TPZGenPartialGrid *this,int64_t i,TPZVec<long> *rectangle_nodes)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = *(this->fNx).fStore;
  iVar3 = (int)(i / (long)iVar4);
  iVar5 = (iVar4 + 1) * iVar3;
  iVar2 = (int)(i % (long)iVar4);
  plVar1 = rectangle_nodes->fStore;
  *plVar1 = (long)(iVar5 + iVar2);
  plVar1[1] = (long)(iVar5 + iVar2 + 1);
  iVar4 = (iVar3 + 1) * (iVar4 + 1);
  plVar1[2] = (long)(iVar4 + iVar2 + 1);
  plVar1[3] = (long)(iVar2 + iVar4);
  return;
}

Assistant:

void TPZGenPartialGrid::ElementConnectivity(int64_t i, TPZVec<int64_t> &rectangle_nodes){
	int xel = i%(fNx[0]);
	int yel = i/(fNx[0]);
	rectangle_nodes[0] = yel*(fNx[0]+1)+xel;
	rectangle_nodes[1] = yel*(fNx[0]+1)+xel+1;
	rectangle_nodes[2] = (yel+1)*(fNx[0]+1)+xel+1;
	rectangle_nodes[3] = (yel+1)*(fNx[0]+1)+xel;
}